

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

void share_xchannel_failure(ssh_sharing_connstate *cs,share_xchannel *xc)

{
  ConnectionLayer *pCVar1;
  strbuf *buf_o;
  
  buf_o = strbuf_new();
  BinarySink_put_uint32(buf_o->binarysink_,(ulong)xc->server_id);
  pCVar1 = cs->parent->cl;
  (*pCVar1->vt->send_packet_from_downstream)
            (pCVar1,cs->id,0x61,buf_o->s,(int)buf_o->len,"downstream refused X channel open");
  strbuf_free(buf_o);
  xc->live = false;
  share_dead_xchannel_respond(cs,xc);
  return;
}

Assistant:

void share_xchannel_failure(struct ssh_sharing_connstate *cs,
                            struct share_xchannel *xc)
{
    /*
     * If downstream refuses to open our X channel at all for some
     * reason, we must respond by sending an emergency CLOSE upstream.
     */
    strbuf *packet = strbuf_new();
    put_uint32(packet, xc->server_id);
    ssh_send_packet_from_downstream(
        cs->parent->cl, cs->id, SSH2_MSG_CHANNEL_CLOSE,
        packet->s, packet->len,
        "downstream refused X channel open");
    strbuf_free(packet);

    /*
     * Now mark the xchannel as dead, and respond to anything sent on
     * it until we see CLOSE for it in turn.
     */
    xc->live = false;
    share_dead_xchannel_respond(cs, xc);
}